

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O3

void __thiscall Object::visualizeEdges(Object *this,Mat *src,Point *obs)

{
  iterator *this_00;
  _Map_pointer ppMVar1;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar2;
  uint uVar3;
  reference pMVar4;
  size_t sVar5;
  _Elt_pointer pMVar6;
  _Elt_pointer pMVar7;
  ulong __n;
  pointer pEVar8;
  char str [8];
  undefined4 local_110 [2];
  Mat *local_108;
  undefined8 local_100;
  long *local_f8;
  undefined8 uStack_f0;
  long local_e8 [3];
  char local_d0 [8];
  double local_c8;
  double dStack_c0;
  Point *local_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Point local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->valid != false) {
    pEVar8 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_b0 = obs;
    if (pEVar8 != local_a8) {
      uVar3 = 0xffffffff;
      local_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6c = 0x406fe000;
      do {
        uVar3 = uVar3 + 1;
        if (pEVar8->valid != false) {
          this_00 = &(pEVar8->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start;
          for (__n = 1; ppMVar1 = (pEVar8->
                                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ).
                                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
              __n < ((long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                    -0x5555555555555555 +
                    ((long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(pEVar8->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                    -0x5555555555555555 +
                    (((long)ppMVar1 -
                      (long)(pEVar8->
                            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ).
                            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                    (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x15; __n = __n + 1) {
            local_100 = 0;
            local_110[0] = 0x3010000;
            local_108 = src;
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n - 1);
            local_c8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0];
            dStack_c0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[1];
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n - 1);
            local_80 = CONCAT44((int)(pMVar4->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data.array[1],(int)local_c8);
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n);
            local_c8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0];
            dStack_c0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[1];
            pMVar4 = std::
                     _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                     ::operator[](this_00,__n);
            local_88 = CONCAT44((int)(pMVar4->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data.array[1],(int)local_c8);
            local_f8 = (long *)CONCAT44(uStack_74,local_78);
            uStack_f0 = CONCAT44(uStack_6c,uStack_70);
            local_e8[0] = 0x406fe00000000000;
            local_e8[1] = 0;
            cv::line(local_110,&local_80,&local_88,&local_f8,3,8,0);
          }
          snprintf(local_d0,8,"%d:%lu",(ulong)uVar3);
          local_100 = 0;
          local_110[0] = 0x3010000;
          local_108 = src;
          local_f8 = local_e8;
          sVar5 = strlen(local_d0);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,local_d0,local_d0 + sVar5);
          local_90 = CONCAT44((int)(this_00->_M_cur->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1] + 10,
                              (int)(this_00->_M_cur->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0] + 10);
          local_58 = CONCAT44(uStack_74,local_78);
          uStack_50 = CONCAT44(uStack_6c,uStack_70);
          local_48 = 0;
          uStack_40 = 0;
          cv::putText(0,local_110,(string *)&local_f8,&local_90,1,&local_58,1,8,0);
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          local_100 = 0;
          local_110[0] = 0x3010000;
          pMVar6 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_98 = CONCAT44((int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1],
                              (int)(pMVar6->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0]);
          local_f8 = (long *)0x406fe00000000000;
          uStack_f0 = 0x406fe00000000000;
          local_e8[0] = 0;
          local_e8[1] = 0;
          local_108 = src;
          cv::circle(local_110,&local_98,3,&local_f8,0xffffffff,8,0);
          local_100 = 0;
          local_110[0] = 0x3010000;
          pMVar6 = (pEVar8->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pMVar6 == (pEVar8->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ).
                        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pMVar2 = (pEVar8->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            pMVar7 = pMVar2 + 0x14;
            pMVar6 = pMVar2 + 0x15;
          }
          else {
            pMVar7 = pMVar6 + -1;
          }
          local_a0 = CONCAT44((int)pMVar6[-1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1],
                              (int)(pMVar7->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0]);
          local_f8 = (long *)0x406fe00000000000;
          uStack_f0 = 0;
          local_e8[0] = 0x406fe00000000000;
          local_e8[1] = 0;
          local_108 = src;
          cv::circle(local_110,&local_a0,3,&local_f8,0xffffffff,8,0);
        }
        pEVar8 = pEVar8 + 1;
      } while (pEVar8 != local_a8);
    }
    local_100 = 0;
    local_110[0] = 0x3010000;
    local_60 = *local_b0;
    local_f8 = (long *)0x0;
    uStack_f0 = 0x406fe00000000000;
    local_e8[0] = 0;
    local_e8[1] = 0;
    local_108 = src;
    cv::circle(local_110,&local_60,4,&local_f8,0xffffffff,8,0);
  }
  return;
}

Assistant:

void Object::visualizeEdges(cv::Mat& src, cv::Point obs) const{
    if (valid == false)
        return;
    int cnt = -1;
    for (const Edge& eg: edges) {
        cnt++;
        if (eg.valid == false) continue;
        for (size_t i = 1; i < eg.size(); i++) {
            cv::line(src, cv::Point(eg[i - 1].x(), eg[i - 1].y()), cv::Point(eg[i].x(), eg[i].y()), cv::Scalar(0, 255, 255), 3);
        }
        char str[8];
        snprintf(str, 8, "%d:%lu", cnt, eg.size());
		cv::putText(src, str, cv::Point(eg.front().x(), eg.front().y()) + cv::Point(10, 10),
					cv::FONT_HERSHEY_PLAIN, 1, cv::Scalar(0, 255, 0));
        cv::circle(src, cv::Point(eg.front().x(), eg.front().y()), 3, cv::Scalar(255, 255, 0), -1);
        cv::circle(src, cv::Point(eg.back().x(), eg.back().y()), 3, cv::Scalar(255, 0, 255), -1);
    }
    cv::circle(src, obs, 4, cv::Scalar(0, 255, 0), -1);
}